

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_RemoveSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  char *pcVar8;
  PClassActor *filter;
  bool bVar9;
  TThinkerIterator<AActor> it;
  int local_50;
  FName local_4c;
  FThinkerIterator local_48;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003e25ae;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e257f:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e25ae:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1899,
                  "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar7 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar7 == (AActor *)0x0) goto LAB_003e2399;
    pPVar3 = (pAVar7->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar7->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar9 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar9) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar9 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e25ae;
    }
  }
  else {
    if (pAVar7 != (AActor *)0x0) goto LAB_003e257f;
LAB_003e2399:
    pAVar7 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e25fe:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189a,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar9 = param[1].field_0.i == 0;
LAB_003e23fc:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e261d:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189b,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_50 = param[2].field_0.i;
LAB_003e240f:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003e2588:
      pcVar8 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003e258f:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x189c,
                    "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (filter != (PClassActor *)0x0) goto LAB_003e2588;
      filter = (PClassActor *)0x0;
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e25fe;
    }
    bVar9 = param[1].field_0.i == 0;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003e23fc;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e261d;
    }
    local_50 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003e240f;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (filter = (PClassActor *)param[3].field_0.field_1.a,
       filter != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar8 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003e258f;
    }
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar8 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003e25cd;
      }
      goto LAB_003e243c;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e25cd:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x189d,
                  "int AF_AActor_A_RemoveSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003e243c:
  iVar2 = param[4].field_0.i;
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  pAVar4 = (pAVar7->master).field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar4 = (AActor *)FThinkerIterator::Next(&local_48,false);
      if (pAVar4 != (AActor *)0x0) {
        do {
          pAVar5 = (pAVar7->master).field_0.p;
          if (pAVar5 == (AActor *)0x0) {
LAB_003e24af:
            pAVar5 = (AActor *)0x0;
          }
          else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar7->master).field_0.p = (AActor *)0x0;
            goto LAB_003e24af;
          }
          pAVar6 = (pAVar4->master).field_0.p;
          if (pAVar6 == (AActor *)0x0) {
LAB_003e24ce:
            pAVar6 = (AActor *)0x0;
          }
          else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (pAVar4->master).field_0.p = (AActor *)0x0;
            goto LAB_003e24ce;
          }
          if ((pAVar4 != pAVar7 && pAVar6 == pAVar5) && (!(bool)(0 < pAVar4->health & bVar9))) {
            local_4c.Index = iVar2;
            DoRemove(pAVar4,local_50,filter,&local_4c);
          }
          pAVar4 = (AActor *)FThinkerIterator::Next(&local_48,false);
        } while (pAVar4 != (AActor *)0x0);
      }
    }
    else {
      (pAVar7->master).field_0.p = (AActor *)0x0;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(removeall);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self && (mo->health <= 0 || removeall))
			{
				DoRemove(mo, flags, filter, species);
			}
		}
	}
	return 0;
}